

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic-expr-visitor.h
# Opt level: O0

void __thiscall
mp::BasicExprVisitor<MockIteratedLogicalVisitor,_TestResult,_mp::internal::ExprTypes>::Visit
          (BasicExprVisitor<MockIteratedLogicalVisitor,_TestResult,_mp::internal::ExprTypes> *this,
          Expr e)

{
  Kind KVar1;
  AssertionFailure *this_00;
  ExprBase e_00;
  ExprBase in_RSI;
  BasicExprVisitor<MockIteratedLogicalVisitor,_TestResult,_mp::internal::ExprTypes> *in_RDI;
  ExprBase in_stack_fffffffffffff918;
  BasicExprVisitor<MockIteratedLogicalVisitor,_TestResult,_mp::internal::ExprTypes>
  *in_stack_fffffffffffff938;
  ExprBase in_stack_fffffffffffff940;
  
  KVar1 = internal::ExprBase::kind((ExprBase *)0x15e3c1);
  e_00.impl_._4_4_ = 0;
  e_00.impl_._0_4_ = KVar1 - FIRST_EXPR;
  switch(e_00.impl_) {
  case (Impl *)0x0:
    internal::ExprTypes::UncheckedCast<mp::NumericConstant>((Expr)in_stack_fffffffffffff918.impl_);
    VisitNumericConstant(in_stack_fffffffffffff938,(NumericConstant)in_stack_fffffffffffff940.impl_)
    ;
    break;
  case (Impl *)0x1:
    internal::ExprTypes::UncheckedCast<mp::Reference>((Expr)in_stack_fffffffffffff918.impl_);
    VisitVariable(in_stack_fffffffffffff938,(Variable)in_stack_fffffffffffff940.impl_);
    break;
  case (Impl *)0x2:
    internal::ExprTypes::UncheckedCast<mp::Reference>((Expr)in_stack_fffffffffffff918.impl_);
    VisitCommonExpr(in_stack_fffffffffffff938,(CommonExpr)in_stack_fffffffffffff940.impl_);
    break;
  case (Impl *)0x3:
    internal::ExprTypes::
    UncheckedCast<mp::BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)4,(mp::expr::Kind)24>>
              ((Expr)in_stack_fffffffffffff918.impl_);
    VisitMinus(in_RDI,(UnaryExpr)e_00.impl_);
    break;
  case (Impl *)0x4:
    internal::ExprTypes::
    UncheckedCast<mp::BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)4,(mp::expr::Kind)24>>
              ((Expr)in_stack_fffffffffffff918.impl_);
    VisitAbs(in_RDI,(UnaryExpr)e_00.impl_);
    break;
  case (Impl *)0x5:
    internal::ExprTypes::
    UncheckedCast<mp::BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)4,(mp::expr::Kind)24>>
              ((Expr)in_stack_fffffffffffff918.impl_);
    VisitFloor(in_RDI,(UnaryExpr)e_00.impl_);
    break;
  case (Impl *)0x6:
    internal::ExprTypes::
    UncheckedCast<mp::BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)4,(mp::expr::Kind)24>>
              ((Expr)in_stack_fffffffffffff918.impl_);
    VisitCeil(in_RDI,(UnaryExpr)e_00.impl_);
    break;
  case (Impl *)0x7:
    internal::ExprTypes::
    UncheckedCast<mp::BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)4,(mp::expr::Kind)24>>
              ((Expr)in_stack_fffffffffffff918.impl_);
    VisitSqrt(in_RDI,(UnaryExpr)e_00.impl_);
    break;
  case (Impl *)0x8:
    internal::ExprTypes::
    UncheckedCast<mp::BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)4,(mp::expr::Kind)24>>
              ((Expr)in_stack_fffffffffffff918.impl_);
    VisitPow2(in_RDI,(UnaryExpr)e_00.impl_);
    break;
  case (Impl *)0x9:
    internal::ExprTypes::
    UncheckedCast<mp::BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)4,(mp::expr::Kind)24>>
              ((Expr)in_stack_fffffffffffff918.impl_);
    VisitExp(in_RDI,(UnaryExpr)e_00.impl_);
    break;
  case (Impl *)0xa:
    internal::ExprTypes::
    UncheckedCast<mp::BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)4,(mp::expr::Kind)24>>
              ((Expr)in_stack_fffffffffffff918.impl_);
    VisitLog(in_RDI,(UnaryExpr)e_00.impl_);
    break;
  case (Impl *)0xb:
    internal::ExprTypes::
    UncheckedCast<mp::BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)4,(mp::expr::Kind)24>>
              ((Expr)in_stack_fffffffffffff918.impl_);
    VisitLog10(in_RDI,(UnaryExpr)e_00.impl_);
    break;
  case (Impl *)0xc:
    internal::ExprTypes::
    UncheckedCast<mp::BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)4,(mp::expr::Kind)24>>
              ((Expr)in_stack_fffffffffffff918.impl_);
    VisitSin(in_RDI,(UnaryExpr)e_00.impl_);
    break;
  case (Impl *)0xd:
    internal::ExprTypes::
    UncheckedCast<mp::BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)4,(mp::expr::Kind)24>>
              ((Expr)in_stack_fffffffffffff918.impl_);
    VisitSinh(in_RDI,(UnaryExpr)e_00.impl_);
    break;
  case (Impl *)0xe:
    internal::ExprTypes::
    UncheckedCast<mp::BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)4,(mp::expr::Kind)24>>
              ((Expr)in_stack_fffffffffffff918.impl_);
    VisitCos(in_RDI,(UnaryExpr)e_00.impl_);
    break;
  case (Impl *)0xf:
    internal::ExprTypes::
    UncheckedCast<mp::BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)4,(mp::expr::Kind)24>>
              ((Expr)in_stack_fffffffffffff918.impl_);
    VisitCosh(in_RDI,(UnaryExpr)e_00.impl_);
    break;
  case (Impl *)0x10:
    internal::ExprTypes::
    UncheckedCast<mp::BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)4,(mp::expr::Kind)24>>
              ((Expr)in_stack_fffffffffffff918.impl_);
    VisitTan(in_RDI,(UnaryExpr)e_00.impl_);
    break;
  case (Impl *)0x11:
    internal::ExprTypes::
    UncheckedCast<mp::BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)4,(mp::expr::Kind)24>>
              ((Expr)in_stack_fffffffffffff918.impl_);
    VisitTanh(in_RDI,(UnaryExpr)e_00.impl_);
    break;
  case (Impl *)0x12:
    internal::ExprTypes::
    UncheckedCast<mp::BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)4,(mp::expr::Kind)24>>
              ((Expr)in_stack_fffffffffffff918.impl_);
    VisitAsin(in_RDI,(UnaryExpr)e_00.impl_);
    break;
  case (Impl *)0x13:
    internal::ExprTypes::
    UncheckedCast<mp::BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)4,(mp::expr::Kind)24>>
              ((Expr)in_stack_fffffffffffff918.impl_);
    VisitAsinh(in_RDI,(UnaryExpr)e_00.impl_);
    break;
  case (Impl *)0x14:
    internal::ExprTypes::
    UncheckedCast<mp::BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)4,(mp::expr::Kind)24>>
              ((Expr)in_stack_fffffffffffff918.impl_);
    VisitAcos(in_RDI,(UnaryExpr)e_00.impl_);
    break;
  case (Impl *)0x15:
    internal::ExprTypes::
    UncheckedCast<mp::BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)4,(mp::expr::Kind)24>>
              ((Expr)in_stack_fffffffffffff918.impl_);
    VisitAcosh(in_RDI,(UnaryExpr)e_00.impl_);
    break;
  case (Impl *)0x16:
    internal::ExprTypes::
    UncheckedCast<mp::BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)4,(mp::expr::Kind)24>>
              ((Expr)in_stack_fffffffffffff918.impl_);
    VisitAtan(in_RDI,(UnaryExpr)e_00.impl_);
    break;
  case (Impl *)0x17:
    internal::ExprTypes::
    UncheckedCast<mp::BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)4,(mp::expr::Kind)24>>
              ((Expr)in_stack_fffffffffffff918.impl_);
    VisitAtanh(in_RDI,(UnaryExpr)e_00.impl_);
    break;
  case (Impl *)0x18:
    internal::ExprTypes::
    UncheckedCast<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)25,(mp::expr::Kind)38>>
              ((Expr)in_stack_fffffffffffff918.impl_);
    VisitAdd(in_RDI,(BinaryExpr)e_00.impl_);
    break;
  case (Impl *)0x19:
    internal::ExprTypes::
    UncheckedCast<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)25,(mp::expr::Kind)38>>
              ((Expr)in_stack_fffffffffffff918.impl_);
    VisitSub(in_RDI,(BinaryExpr)e_00.impl_);
    break;
  case (Impl *)0x1a:
    internal::ExprTypes::
    UncheckedCast<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)25,(mp::expr::Kind)38>>
              ((Expr)in_stack_fffffffffffff918.impl_);
    VisitLess(in_RDI,(BinaryExpr)e_00.impl_);
    break;
  case (Impl *)0x1b:
    internal::ExprTypes::
    UncheckedCast<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)25,(mp::expr::Kind)38>>
              ((Expr)in_stack_fffffffffffff918.impl_);
    VisitMul(in_RDI,(BinaryExpr)e_00.impl_);
    break;
  case (Impl *)0x1c:
    internal::ExprTypes::
    UncheckedCast<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)25,(mp::expr::Kind)38>>
              ((Expr)in_stack_fffffffffffff918.impl_);
    VisitDiv(in_RDI,(BinaryExpr)e_00.impl_);
    break;
  case (Impl *)0x1d:
    internal::ExprTypes::
    UncheckedCast<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)25,(mp::expr::Kind)38>>
              ((Expr)in_stack_fffffffffffff918.impl_);
    VisitTruncDiv(in_RDI,(BinaryExpr)e_00.impl_);
    break;
  case (Impl *)0x1e:
    internal::ExprTypes::
    UncheckedCast<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)25,(mp::expr::Kind)38>>
              ((Expr)in_stack_fffffffffffff918.impl_);
    VisitMod(in_RDI,(BinaryExpr)e_00.impl_);
    break;
  case (Impl *)0x1f:
    internal::ExprTypes::
    UncheckedCast<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)25,(mp::expr::Kind)38>>
              ((Expr)in_stack_fffffffffffff918.impl_);
    VisitPow(in_RDI,(BinaryExpr)e_00.impl_);
    break;
  case (Impl *)0x20:
    internal::ExprTypes::
    UncheckedCast<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)25,(mp::expr::Kind)38>>
              ((Expr)in_stack_fffffffffffff918.impl_);
    VisitPowConstBase(in_RDI,(BinaryExpr)e_00.impl_);
    break;
  case (Impl *)0x21:
    internal::ExprTypes::
    UncheckedCast<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)25,(mp::expr::Kind)38>>
              ((Expr)in_stack_fffffffffffff918.impl_);
    VisitPowConstExp(in_RDI,(BinaryExpr)e_00.impl_);
    break;
  case (Impl *)0x22:
    internal::ExprTypes::
    UncheckedCast<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)25,(mp::expr::Kind)38>>
              ((Expr)in_stack_fffffffffffff918.impl_);
    VisitAtan2(in_RDI,(BinaryExpr)e_00.impl_);
    break;
  case (Impl *)0x23:
    internal::ExprTypes::
    UncheckedCast<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)25,(mp::expr::Kind)38>>
              ((Expr)in_stack_fffffffffffff918.impl_);
    VisitPrecision(in_RDI,(BinaryExpr)e_00.impl_);
    break;
  case (Impl *)0x24:
    internal::ExprTypes::
    UncheckedCast<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)25,(mp::expr::Kind)38>>
              ((Expr)in_stack_fffffffffffff918.impl_);
    VisitRound(in_RDI,(BinaryExpr)e_00.impl_);
    break;
  case (Impl *)0x25:
    internal::ExprTypes::
    UncheckedCast<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)25,(mp::expr::Kind)38>>
              ((Expr)in_stack_fffffffffffff918.impl_);
    VisitTrunc(in_RDI,(BinaryExpr)e_00.impl_);
    break;
  case (Impl *)0x26:
    internal::ExprTypes::
    UncheckedCast<mp::BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)39>>
              ((Expr)in_stack_fffffffffffff918.impl_);
    VisitIf(in_stack_fffffffffffff938,(IfExpr)in_stack_fffffffffffff940.impl_);
    break;
  case (Impl *)0x27:
    internal::ExprTypes::UncheckedCast<mp::PLTerm>((Expr)in_stack_fffffffffffff918.impl_);
    VisitPLTerm(in_stack_fffffffffffff938,(PLTerm)in_stack_fffffffffffff940.impl_);
    break;
  case (Impl *)0x28:
    internal::ExprTypes::UncheckedCast<mp::CallExpr>((Expr)in_stack_fffffffffffff918.impl_);
    VisitCall(in_stack_fffffffffffff938,(CallExpr)in_stack_fffffffffffff940.impl_);
    break;
  case (Impl *)0x29:
    internal::ExprTypes::
    UncheckedCast<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)42,(mp::expr::Kind)45>>
              ((Expr)in_stack_fffffffffffff918.impl_);
    VisitMin(in_RDI,(VarArgExpr)e_00.impl_);
    break;
  case (Impl *)0x2a:
    internal::ExprTypes::
    UncheckedCast<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)42,(mp::expr::Kind)45>>
              ((Expr)in_stack_fffffffffffff918.impl_);
    VisitMax(in_RDI,(VarArgExpr)e_00.impl_);
    break;
  case (Impl *)0x2b:
    internal::ExprTypes::
    UncheckedCast<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)42,(mp::expr::Kind)45>>
              ((Expr)in_stack_fffffffffffff918.impl_);
    VisitSum(in_stack_fffffffffffff938,(SumExpr)in_stack_fffffffffffff940.impl_);
    break;
  case (Impl *)0x2c:
    internal::ExprTypes::
    UncheckedCast<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)42,(mp::expr::Kind)45>>
              ((Expr)in_stack_fffffffffffff918.impl_);
    VisitNumberOf(in_stack_fffffffffffff938,(NumberOfExpr)in_stack_fffffffffffff940.impl_);
    break;
  case (Impl *)0x2d:
    internal::ExprTypes::
    UncheckedCast<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)71>,(mp::expr::Kind)46,(mp::expr::Kind)46>>
              ((Expr)in_stack_fffffffffffff918.impl_);
    VisitNumberOfSym(in_stack_fffffffffffff938,(SymbolicNumberOfExpr)in_stack_fffffffffffff940.impl_
                    );
    break;
  case (Impl *)0x2e:
    internal::ExprTypes::
    UncheckedCast<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>,(mp::expr::Kind)47,(mp::expr::Kind)47>>
              ((Expr)in_stack_fffffffffffff918.impl_);
    VisitCount(in_stack_fffffffffffff938,(CountExpr)in_stack_fffffffffffff940.impl_);
    break;
  case (Impl *)0x2f:
    internal::ExprTypes::UncheckedCast<mp::LogicalConstant>((Expr)in_stack_fffffffffffff918.impl_);
    VisitLogicalConstant(in_stack_fffffffffffff938,(LogicalConstant)in_stack_fffffffffffff940.impl_)
    ;
    break;
  case (Impl *)0x30:
    internal::ExprTypes::
    UncheckedCast<mp::BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>,(mp::expr::Kind)49,(mp::expr::Kind)49>>
              ((Expr)in_stack_fffffffffffff918.impl_);
    VisitNot(in_stack_fffffffffffff938,(NotExpr)in_stack_fffffffffffff940.impl_);
    break;
  case (Impl *)0x31:
    internal::ExprTypes::
    UncheckedCast<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>,(mp::expr::Kind)50,(mp::expr::Kind)52>>
              ((Expr)in_stack_fffffffffffff918.impl_);
    VisitOr(in_RDI,(BinaryLogicalExpr)e_00.impl_);
    break;
  case (Impl *)0x32:
    internal::ExprTypes::
    UncheckedCast<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>,(mp::expr::Kind)50,(mp::expr::Kind)52>>
              ((Expr)in_stack_fffffffffffff918.impl_);
    VisitAnd(in_RDI,(BinaryLogicalExpr)e_00.impl_);
    break;
  case (Impl *)0x33:
    internal::ExprTypes::
    UncheckedCast<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>,(mp::expr::Kind)50,(mp::expr::Kind)52>>
              ((Expr)in_stack_fffffffffffff918.impl_);
    VisitIff(in_RDI,(BinaryLogicalExpr)e_00.impl_);
    break;
  case (Impl *)0x34:
    internal::ExprTypes::
    UncheckedCast<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)53,(mp::expr::Kind)58>>
              ((Expr)in_stack_fffffffffffff918.impl_);
    VisitLT(in_RDI,(RelationalExpr)e_00.impl_);
    break;
  case (Impl *)0x35:
    internal::ExprTypes::
    UncheckedCast<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)53,(mp::expr::Kind)58>>
              ((Expr)in_stack_fffffffffffff918.impl_);
    VisitLE(in_RDI,(RelationalExpr)e_00.impl_);
    break;
  case (Impl *)0x36:
    internal::ExprTypes::
    UncheckedCast<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)53,(mp::expr::Kind)58>>
              ((Expr)in_stack_fffffffffffff918.impl_);
    VisitEQ(in_RDI,(RelationalExpr)e_00.impl_);
    break;
  case (Impl *)0x37:
    internal::ExprTypes::
    UncheckedCast<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)53,(mp::expr::Kind)58>>
              ((Expr)in_stack_fffffffffffff918.impl_);
    VisitGE(in_RDI,(RelationalExpr)e_00.impl_);
    break;
  case (Impl *)0x38:
    internal::ExprTypes::
    UncheckedCast<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)53,(mp::expr::Kind)58>>
              ((Expr)in_stack_fffffffffffff918.impl_);
    VisitGT(in_RDI,(RelationalExpr)e_00.impl_);
    break;
  case (Impl *)0x39:
    internal::ExprTypes::
    UncheckedCast<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)53,(mp::expr::Kind)58>>
              ((Expr)in_stack_fffffffffffff918.impl_);
    VisitNE(in_RDI,(RelationalExpr)e_00.impl_);
    break;
  case (Impl *)0x3a:
    internal::ExprTypes::UncheckedCast<mp::LogicalCountExpr>((Expr)in_stack_fffffffffffff918.impl_);
    VisitAtLeast(in_RDI,(LogicalCountExpr)e_00.impl_);
    break;
  case (Impl *)0x3b:
    internal::ExprTypes::UncheckedCast<mp::LogicalCountExpr>((Expr)in_stack_fffffffffffff918.impl_);
    VisitAtMost(in_RDI,(LogicalCountExpr)e_00.impl_);
    break;
  case (Impl *)0x3c:
    internal::ExprTypes::UncheckedCast<mp::LogicalCountExpr>((Expr)in_stack_fffffffffffff918.impl_);
    VisitExactly(in_RDI,(LogicalCountExpr)e_00.impl_);
    break;
  case (Impl *)0x3d:
    internal::ExprTypes::UncheckedCast<mp::LogicalCountExpr>((Expr)in_stack_fffffffffffff918.impl_);
    VisitNotAtLeast(in_RDI,(LogicalCountExpr)e_00.impl_);
    break;
  case (Impl *)0x3e:
    internal::ExprTypes::UncheckedCast<mp::LogicalCountExpr>((Expr)in_stack_fffffffffffff918.impl_);
    VisitNotAtMost(in_RDI,(LogicalCountExpr)e_00.impl_);
    break;
  case (Impl *)0x3f:
    internal::ExprTypes::UncheckedCast<mp::LogicalCountExpr>((Expr)in_stack_fffffffffffff918.impl_);
    VisitNotExactly(in_RDI,(LogicalCountExpr)e_00.impl_);
    break;
  case (Impl *)0x40:
    internal::ExprTypes::
    UncheckedCast<mp::BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>,(mp::expr::Kind)65>>
              ((Expr)in_stack_fffffffffffff918.impl_);
    VisitImplication(in_stack_fffffffffffff938,(ImplicationExpr)in_stack_fffffffffffff940.impl_);
    break;
  case (Impl *)0x41:
    internal::ExprTypes::
    UncheckedCast<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>,(mp::expr::Kind)66,(mp::expr::Kind)67>>
              ((Expr)in_stack_fffffffffffff918.impl_);
    VisitExists(in_RDI,(IteratedLogicalExpr)e_00.impl_);
    break;
  case (Impl *)0x42:
    internal::ExprTypes::
    UncheckedCast<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>,(mp::expr::Kind)66,(mp::expr::Kind)67>>
              ((Expr)in_stack_fffffffffffff918.impl_);
    VisitForAll(in_RDI,(IteratedLogicalExpr)e_00.impl_);
    break;
  case (Impl *)0x43:
    internal::ExprTypes::
    UncheckedCast<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)68,(mp::expr::Kind)69>>
              ((Expr)in_stack_fffffffffffff918.impl_);
    VisitAllDiff(in_stack_fffffffffffff938,(PairwiseExpr)in_stack_fffffffffffff940.impl_);
    break;
  case (Impl *)0x44:
    internal::ExprTypes::
    UncheckedCast<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)68,(mp::expr::Kind)69>>
              ((Expr)in_stack_fffffffffffff918.impl_);
    VisitNotAllDiff(in_stack_fffffffffffff938,(PairwiseExpr)in_stack_fffffffffffff940.impl_);
    break;
  case (Impl *)0x45:
    internal::ExprTypes::UncheckedCast<mp::StringLiteral>((Expr)in_stack_fffffffffffff918.impl_);
    VisitStringLiteral(in_stack_fffffffffffff938,(StringLiteral)in_stack_fffffffffffff940.impl_);
    break;
  case (Impl *)0x46:
    internal::ExprTypes::
    UncheckedCast<mp::BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)71>,(mp::expr::Kind)71>>
              ((Expr)in_stack_fffffffffffff918.impl_);
    VisitSymbolicIf(in_stack_fffffffffffff938,(SymbolicIfExpr)in_RSI.impl_);
    break;
  default:
    this_00 = (AssertionFailure *)__cxa_allocate_exception(0x10);
    AssertionFailure::AssertionFailure(this_00,(char *)in_stack_fffffffffffff918.impl_);
    __cxa_throw(this_00,&AssertionFailure::typeinfo,AssertionFailure::~AssertionFailure);
  }
  return;
}

Assistant:

Result BasicExprVisitor<Impl, Result, ET>::Visit(Expr e) {
  // All expressions except OPNUMBEROFs and OPIFSYM are supported.
  switch (e.kind()) {
  default:
    MP_ASSERT(false, "invalid expression");
    // Fall through.
  case expr::NUMBER:
    return MP_DISPATCH(VisitNumericConstant(
                         ET::template UncheckedCast<NumericConstant>(e)));
  case expr::VARIABLE:
    return MP_DISPATCH(VisitVariable(ET::template UncheckedCast<Variable>(e)));
  case expr::COMMON_EXPR:
    return MP_DISPATCH(VisitCommonExpr(
                         ET::template UncheckedCast<CommonExpr>(e)));

  // Unary expressions.
  case expr::MINUS:
    return MP_DISPATCH(VisitMinus(ET::template UncheckedCast<UnaryExpr>(e)));
  case expr::ABS:
    return MP_DISPATCH(VisitAbs(ET::template UncheckedCast<UnaryExpr>(e)));
  case expr::FLOOR:
    return MP_DISPATCH(VisitFloor(ET::template UncheckedCast<UnaryExpr>(e)));
  case expr::CEIL:
    return MP_DISPATCH(VisitCeil(ET::template UncheckedCast<UnaryExpr>(e)));
  case expr::SQRT:
    return MP_DISPATCH(VisitSqrt(ET::template UncheckedCast<UnaryExpr>(e)));
  case expr::POW2:
    return MP_DISPATCH(VisitPow2(ET::template UncheckedCast<UnaryExpr>(e)));
  case expr::EXP:
    return MP_DISPATCH(VisitExp(ET::template UncheckedCast<UnaryExpr>(e)));
  case expr::LOG:
    return MP_DISPATCH(VisitLog(ET::template UncheckedCast<UnaryExpr>(e)));
  case expr::LOG10:
    return MP_DISPATCH(VisitLog10(ET::template UncheckedCast<UnaryExpr>(e)));
  case expr::SIN:
    return MP_DISPATCH(VisitSin(ET::template UncheckedCast<UnaryExpr>(e)));
  case expr::SINH:
    return MP_DISPATCH(VisitSinh(ET::template UncheckedCast<UnaryExpr>(e)));
  case expr::COS:
    return MP_DISPATCH(VisitCos(ET::template UncheckedCast<UnaryExpr>(e)));
  case expr::COSH:
    return MP_DISPATCH(VisitCosh(ET::template UncheckedCast<UnaryExpr>(e)));
  case expr::TAN:
    return MP_DISPATCH(VisitTan(ET::template UncheckedCast<UnaryExpr>(e)));
  case expr::TANH:
    return MP_DISPATCH(VisitTanh(ET::template UncheckedCast<UnaryExpr>(e)));
  case expr::ASIN:
    return MP_DISPATCH(VisitAsin(ET::template UncheckedCast<UnaryExpr>(e)));
  case expr::ASINH:
    return MP_DISPATCH(VisitAsinh(ET::template UncheckedCast<UnaryExpr>(e)));
  case expr::ACOS:
    return MP_DISPATCH(VisitAcos(ET::template UncheckedCast<UnaryExpr>(e)));
  case expr::ACOSH:
    return MP_DISPATCH(VisitAcosh(ET::template UncheckedCast<UnaryExpr>(e)));
  case expr::ATAN:
    return MP_DISPATCH(VisitAtan(ET::template UncheckedCast<UnaryExpr>(e)));
  case expr::ATANH:
    return MP_DISPATCH(VisitAtanh(ET::template UncheckedCast<UnaryExpr>(e)));

  // Binary expressions.
  case expr::ADD:
    return MP_DISPATCH(VisitAdd(ET::template UncheckedCast<BinaryExpr>(e)));
  case expr::SUB:
    return MP_DISPATCH(VisitSub(ET::template UncheckedCast<BinaryExpr>(e)));
  case expr::LESS:
    return MP_DISPATCH(VisitLess(ET::template UncheckedCast<BinaryExpr>(e)));
  case expr::MUL:
    return MP_DISPATCH(VisitMul(ET::template UncheckedCast<BinaryExpr>(e)));
  case expr::DIV:
    return MP_DISPATCH(VisitDiv(ET::template UncheckedCast<BinaryExpr>(e)));
  case expr::TRUNC_DIV:
    return MP_DISPATCH(VisitTruncDiv(
                         ET::template UncheckedCast<BinaryExpr>(e)));
  case expr::MOD:
    return MP_DISPATCH(VisitMod(ET::template UncheckedCast<BinaryExpr>(e)));
  case expr::POW:
    return MP_DISPATCH(VisitPow(ET::template UncheckedCast<BinaryExpr>(e)));
  case expr::POW_CONST_BASE:
    return MP_DISPATCH(VisitPowConstBase(
                         ET::template UncheckedCast<BinaryExpr>(e)));
  case expr::POW_CONST_EXP:
    return MP_DISPATCH(VisitPowConstExp(
                         ET::template UncheckedCast<BinaryExpr>(e)));
  case expr::ATAN2:
    return MP_DISPATCH(VisitAtan2(ET::template UncheckedCast<BinaryExpr>(e)));
  case expr::PRECISION:
    return MP_DISPATCH(VisitPrecision(
                         ET::template UncheckedCast<BinaryExpr>(e)));
  case expr::ROUND:
    return MP_DISPATCH(VisitRound(ET::template UncheckedCast<BinaryExpr>(e)));
  case expr::TRUNC:
    return MP_DISPATCH(VisitTrunc(ET::template UncheckedCast<BinaryExpr>(e)));

  case expr::IF:
    return MP_DISPATCH(VisitIf(ET::template UncheckedCast<IfExpr>(e)));
  case expr::PLTERM:
    return MP_DISPATCH(VisitPLTerm(ET::template UncheckedCast<PLTerm>(e)));
  case expr::CALL:
    return MP_DISPATCH(VisitCall(ET::template UncheckedCast<CallExpr>(e)));
  case expr::MIN:
    return MP_DISPATCH(VisitMin(ET::template UncheckedCast<VarArgExpr>(e)));
  case expr::MAX:
    return MP_DISPATCH(VisitMax(ET::template UncheckedCast<VarArgExpr>(e)));
  case expr::SUM:
    return MP_DISPATCH(VisitSum(ET::template UncheckedCast<SumExpr>(e)));
  case expr::NUMBEROF:
    return MP_DISPATCH(VisitNumberOf(
                         ET::template UncheckedCast<NumberOfExpr>(e)));
  case expr::NUMBEROF_SYM:
    return MP_DISPATCH(VisitNumberOfSym(
                         ET::template UncheckedCast<SymbolicNumberOfExpr>(e)));
  case expr::COUNT:
    return MP_DISPATCH(VisitCount(ET::template UncheckedCast<CountExpr>(e)));

    // Logical expressions.
  case expr::BOOL:
    return MP_DISPATCH(VisitLogicalConstant(
                         ET::template UncheckedCast<LogicalConstant>(e)));
  case expr::NOT:
    return MP_DISPATCH(VisitNot(ET::template UncheckedCast<NotExpr>(e)));
  case expr::OR:
    return MP_DISPATCH(VisitOr(
                         ET::template UncheckedCast<BinaryLogicalExpr>(e)));
  case expr::AND:
    return MP_DISPATCH(VisitAnd(
                         ET::template UncheckedCast<BinaryLogicalExpr>(e)));
  case expr::IFF:
    return MP_DISPATCH(VisitIff(
                         ET::template UncheckedCast<BinaryLogicalExpr>(e)));
  case expr::LT:
    return MP_DISPATCH(VisitLT(ET::template UncheckedCast<RelationalExpr>(e)));
  case expr::LE:
    return MP_DISPATCH(VisitLE(ET::template UncheckedCast<RelationalExpr>(e)));
  case expr::EQ:
    return MP_DISPATCH(VisitEQ(ET::template UncheckedCast<RelationalExpr>(e)));
  case expr::GE:
    return MP_DISPATCH(VisitGE(ET::template UncheckedCast<RelationalExpr>(e)));
  case expr::GT:
    return MP_DISPATCH(VisitGT(ET::template UncheckedCast<RelationalExpr>(e)));
  case expr::NE:
    return MP_DISPATCH(VisitNE(ET::template UncheckedCast<RelationalExpr>(e)));
  case expr::ATLEAST:
    return MP_DISPATCH(VisitAtLeast(
                         ET::template UncheckedCast<LogicalCountExpr>(e)));
  case expr::ATMOST:
    return MP_DISPATCH(VisitAtMost(
                         ET::template UncheckedCast<LogicalCountExpr>(e)));
  case expr::EXACTLY:
    return MP_DISPATCH(VisitExactly(
                         ET::template UncheckedCast<LogicalCountExpr>(e)));
  case expr::NOT_ATLEAST:
    return MP_DISPATCH(VisitNotAtLeast(
                         ET::template UncheckedCast<LogicalCountExpr>(e)));
  case expr::NOT_ATMOST:
    return MP_DISPATCH(VisitNotAtMost(
                         ET::template UncheckedCast<LogicalCountExpr>(e)));
  case expr::NOT_EXACTLY:
    return MP_DISPATCH(VisitNotExactly(
                         ET::template UncheckedCast<LogicalCountExpr>(e)));
  case expr::IMPLICATION:
    return MP_DISPATCH(VisitImplication(
                         ET::template UncheckedCast<ImplicationExpr>(e)));
  case expr::EXISTS:
    return MP_DISPATCH(VisitExists(
                         ET::template UncheckedCast<IteratedLogicalExpr>(e)));
  case expr::FORALL:
    return MP_DISPATCH(VisitForAll(
                         ET::template UncheckedCast<IteratedLogicalExpr>(e)));
  case expr::ALLDIFF:
    return MP_DISPATCH(VisitAllDiff(
                         ET::template UncheckedCast<PairwiseExpr>(e)));
  case expr::NOT_ALLDIFF:
    return MP_DISPATCH(VisitNotAllDiff(
                         ET::template UncheckedCast<PairwiseExpr>(e)));

    // String expressions.
  case expr::STRING:
    return MP_DISPATCH(VisitStringLiteral(
                         ET::template UncheckedCast<StringLiteral>(e)));
  case expr::IFSYM:
    return MP_DISPATCH(VisitSymbolicIf(
                         ET::template UncheckedCast<SymbolicIfExpr>(e)));
  }
}